

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitBrOn(BinaryInstWriter *this,BrOn *curr)

{
  BrOnOp BVar1;
  BufferWithRandomAccess *pBVar2;
  WasmBinaryWriter *pWVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  Exactness EVar7;
  HeapType HVar8;
  U32LEB local_68;
  byte local_61;
  Type TStack_60;
  uint8_t flags;
  uintptr_t local_58;
  U32LEB local_50;
  U32LEB local_4c;
  size_t local_48;
  char *local_40;
  U32LEB local_34;
  size_t local_30;
  char *local_28;
  U32LEB local_1c;
  BrOn *local_18;
  BrOn *curr_local;
  BinaryInstWriter *this_local;
  
  BVar1 = curr->op;
  local_18 = curr;
  curr_local = (BrOn *)this;
  if (BVar1 == BrOnNull) {
    BufferWithRandomAccess::operator<<(this->o,-0x2b);
    pBVar2 = this->o;
    local_30 = (local_18->name).super_IString.str._M_len;
    local_28 = (local_18->name).super_IString.str._M_str;
    uVar6 = getBreakIndex(this,(Name)(local_18->name).super_IString.str);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,uVar6);
    BufferWithRandomAccess::operator<<(pBVar2,local_1c);
  }
  else if (BVar1 == BrOnNonNull) {
    BufferWithRandomAccess::operator<<(this->o,-0x2a);
    pBVar2 = this->o;
    local_48 = (local_18->name).super_IString.str._M_len;
    local_40 = (local_18->name).super_IString.str._M_str;
    uVar6 = getBreakIndex(this,(Name)(local_18->name).super_IString.str);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_34,uVar6);
    BufferWithRandomAccess::operator<<(pBVar2,local_34);
  }
  else {
    if (1 < BVar1 - BrOnCast) {
      handle_unreachable("invalid br_on_*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x90a);
    }
    BufferWithRandomAccess::operator<<(this->o,-5);
    if (local_18->op == BrOnCast) {
      pBVar2 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_4c,0x18);
      BufferWithRandomAccess::operator<<(pBVar2,local_4c);
    }
    else {
      pBVar2 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_50,0x19);
      BufferWithRandomAccess::operator<<(pBVar2,local_50);
    }
    bVar4 = wasm::Type::isRef(&local_18->ref->type);
    if (!bVar4) {
      __assert_fail("curr->ref->type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                    ,0x8fd,"void wasm::BinaryInstWriter::visitBrOn(BrOn *)");
    }
    local_58 = (local_18->castType).id;
    TStack_60.id = (local_18->ref->type).id;
    bVar4 = wasm::Type::isSubType((Type)local_58,TStack_60);
    if (!bVar4) {
      __assert_fail("Type::isSubType(curr->castType, curr->ref->type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                    ,0x8fe,"void wasm::BinaryInstWriter::visitBrOn(BrOn *)");
    }
    bVar4 = wasm::Type::isNullable(&local_18->ref->type);
    bVar5 = wasm::Type::isNullable(&local_18->castType);
    local_61 = 0;
    if (bVar5) {
      local_61 = 2;
    }
    local_61 = bVar4 | local_61;
    BufferWithRandomAccess::operator<<(this->o,local_61);
    pBVar2 = this->o;
    uVar6 = getBreakIndex(this,(Name)(local_18->name).super_IString.str);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_68,uVar6);
    BufferWithRandomAccess::operator<<(pBVar2,local_68);
    pWVar3 = this->parent;
    HVar8 = wasm::Type::getHeapType(&local_18->ref->type);
    EVar7 = wasm::Type::getExactness(&local_18->ref->type);
    WasmBinaryWriter::writeHeapType(pWVar3,HVar8,EVar7);
    pWVar3 = this->parent;
    HVar8 = wasm::Type::getHeapType(&local_18->castType);
    EVar7 = wasm::Type::getExactness(&local_18->castType);
    WasmBinaryWriter::writeHeapType(pWVar3,HVar8,EVar7);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitBrOn(BrOn* curr) {
  switch (curr->op) {
    case BrOnNull:
      o << int8_t(BinaryConsts::BrOnNull);
      o << U32LEB(getBreakIndex(curr->name));
      return;
    case BrOnNonNull:
      o << int8_t(BinaryConsts::BrOnNonNull);
      o << U32LEB(getBreakIndex(curr->name));
      return;
    case BrOnCast:
    case BrOnCastFail: {
      o << int8_t(BinaryConsts::GCPrefix);
      if (curr->op == BrOnCast) {
        o << U32LEB(BinaryConsts::BrOnCast);
      } else {
        o << U32LEB(BinaryConsts::BrOnCastFail);
      }
      assert(curr->ref->type.isRef());
      assert(Type::isSubType(curr->castType, curr->ref->type));
      uint8_t flags = (curr->ref->type.isNullable() ? 1 : 0) |
                      (curr->castType.isNullable() ? 2 : 0);
      o << flags;
      o << U32LEB(getBreakIndex(curr->name));
      parent.writeHeapType(curr->ref->type.getHeapType(),
                           curr->ref->type.getExactness());
      parent.writeHeapType(curr->castType.getHeapType(),
                           curr->castType.getExactness());
      return;
    }
  }
  WASM_UNREACHABLE("invalid br_on_*");
}